

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_str.c
# Opt level: O0

size_t ares_strcpy(char *dest,char *src,size_t dest_size)

{
  char *local_30;
  size_t len;
  size_t dest_size_local;
  char *src_local;
  char *dest_local;
  
  if ((dest == (char *)0x0) || (dest_size == 0)) {
    dest_local = (char *)0x0;
  }
  else {
    local_30 = (char *)ares_strlen(src);
    if (dest_size <= local_30) {
      local_30 = (char *)(dest_size - 1);
    }
    if (local_30 != (char *)0x0) {
      memcpy(dest,src,(size_t)local_30);
    }
    dest[(long)local_30] = '\0';
    dest_local = local_30;
  }
  return (size_t)dest_local;
}

Assistant:

size_t ares_strcpy(char *dest, const char *src, size_t dest_size)
{
  size_t len = 0;

  if (dest == NULL || dest_size == 0) {
    return 0; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  len = ares_strlen(src);

  if (len >= dest_size) {
    len = dest_size - 1;
  }

  if (len) {
    memcpy(dest, src, len);
  }

  dest[len] = 0;
  return len;
}